

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd.c
# Opt level: O0

void NJD_remove_silent_node(NJD *njd)

{
  int iVar1;
  char *__s1;
  NJDNode *node_00;
  undefined8 *in_RDI;
  NJDNode *node;
  NJDNode *in_stack_ffffffffffffffe8;
  
  node_00 = (NJDNode *)*in_RDI;
  while (node_00 != (NJDNode *)0x0) {
    __s1 = NJDNode_get_pron(node_00);
    iVar1 = strcmp(__s1,"*");
    if (iVar1 == 0) {
      node_00 = NJD_remove_node((NJD *)node_00,in_stack_ffffffffffffffe8);
    }
    else {
      node_00 = node_00->next;
    }
  }
  return;
}

Assistant:

void NJD_remove_silent_node(NJD * njd)
{
   NJDNode *node;

   for (node = njd->head; node != NULL;)
      if (strcmp(NJDNode_get_pron(node), "*") == 0)
         node = NJD_remove_node(njd, node);
      else
         node = node->next;
}